

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specreaderimpl.cpp
# Opt level: O3

bool apngasm::spec::priv::anon_unknown_0::str2delay(string *str,Delay *pOut)

{
  anon_unknown_0 *this;
  string *str_00;
  bool bVar1;
  void *pvVar2;
  size_type __n;
  char *__data;
  size_type __n_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (pOut == (Delay *)0x0) {
LAB_00155d71:
    bVar1 = false;
  }
  else {
    this = (anon_unknown_0 *)(str->_M_dataplus)._M_p;
    str_00 = (string *)str->_M_string_length;
    if (str_00 == (string *)0x0) {
LAB_00155c82:
      bVar1 = s2u(this,str_00,&pOut->num);
      if (!bVar1) goto LAB_00155d71;
      pOut->den = 1000;
    }
    else {
      pvVar2 = memchr(this,0x2f,(size_t)str_00);
      __n_00 = (long)pvVar2 - (long)this;
      if (pvVar2 == (void *)0x0 || __n_00 == 0xffffffffffffffff) goto LAB_00155c82;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_48,str,0,__n_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_68,str,__n_00 + 1,str->_M_string_length);
      bVar1 = s2u((anon_unknown_0 *)local_48._M_dataplus._M_p,(string *)local_48._M_string_length,
                  &pOut->num);
      if (!bVar1) {
LAB_00155d3b:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00155d71;
      }
      bVar1 = s2u((anon_unknown_0 *)local_68._M_dataplus._M_p,(string *)local_68._M_string_length,
                  &pOut->den);
      if (!bVar1) goto LAB_00155d3b;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool str2delay(const std::string& str, Delay* pOut)
        {
          if(pOut == NULL)
            return false;

          static const char delimiter = '/';
          const std::string::size_type index = str.find(delimiter, 0);

          // Numerator only.
          if(index == std::string::npos)
          {
            if( !s2u(str, &pOut->num) )
              return false;
            pOut->den = DEFAULT_FRAME_DENOMINATOR;
          }

          // Numerator / Denominator
          else
          {
            const std::string& num = str.substr(0, index);
            const std::string& den = str.substr(index+1, str.length());

            if( !s2u(num, &pOut->num) || !s2u(den, &pOut->den) )
              return false;
          }

          return true;
        }